

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O2

bool __thiscall cursespp::NumberValidator<int>::IsValid(NumberValidator<int> *this,string *input)

{
  bool bVar1;
  double dVar2;
  invalid_argument anon_var_0;
  
  dVar2 = std::__cxx11::stod(input,(size_t *)0x0);
  if ((this->maximum == 0x7fffffff) ||
     ((bVar1 = false, (double)this->minimum <= dVar2 && (dVar2 <= (double)this->maximum)))) {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool IsValid(const std::string& input) const override {
            try {
                double result = std::stod(input);
                if (bounded(minimum, maximum) && (result < minimum || result > maximum)) {
                    return false;
                }
            }
            catch (std::invalid_argument) {
                return false;
            }
            return true;
        }